

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::StereoPannerDownmix::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          StereoPannerDownmix *this,Vector3d *position)

{
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar1;
  DenseStorage<double,__1,__1,_1,_0> *other;
  RealScalar RVar2;
  Scalar SVar3;
  Scalar SVar4;
  Matrix<double,__1,_1,_0,__1,_1> local_110;
  VectorXd _pv;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  Scalar local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_c8;
  MatrixXd downmix;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_c8.m_lhs._0_4_ = 2;
  pv.super_type._0_4_ = 5;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&downmix,(int *)&local_c8,(int *)&pv);
  pv.super_type.m_initialized = false;
  pv.super_type._1_7_ = 0x3ff00000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_c8,
             (Matrix<double,__1,__1,_0,__1,__1> *)&downmix,(Scalar *)&pv);
  _pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_c8,
                      (Scalar *)&_pv);
  local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x3fe279a74590331c;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,(Scalar *)&local_110);
  local_d0 = 0.7071067811865476;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_d0);
  local_50 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_50);
  local_58 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_58);
  local_60 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_60);
  local_68 = 0.5773502691896257;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_68);
  local_70 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar1,&local_70);
  local_78 = 0.7071067811865476;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar1,&local_78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_c8);
  local_38 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  local_48 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0];
  dStack_40 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
  (**((this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_PointSourcePanner)(&pv);
  if (pv.super_type.m_initialized == true) {
    other = (DenseStorage<double,__1,__1,_1,_0> *)
            boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get(&pv);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&_pv,other);
    local_c8._0_16_ =
         Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&downmix,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&_pv);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_110,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_c8);
    RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                      ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_110);
    local_c8.m_lhs = (LhsNested)RVar2;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_110,(Scalar *)&local_c8)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<int>
              ((Type *)&local_c8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&_pv,3);
    SVar3 = Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::
            maxCoeff<0>((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                         *)&local_c8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<int>
              ((Type *)&local_c8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&_pv,2);
    SVar4 = Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::
            maxCoeff<0>((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                         *)&local_c8);
    local_d0 = exp2((SVar4 * -0.5) / (SVar3 + SVar4));
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
              (&local_c8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_110,&local_d0);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              (&local_110,&local_c8);
    (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
         (type)local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
    *(Index *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
         local_110.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    (__return_storage_ptr__->super_type).m_initialized = true;
    free(_pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional_base
            (&pv.super_type);
  free(downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> StereoPannerDownmix::handle(
      Eigen::Vector3d position) const {
    Eigen::MatrixXd downmix(2, 5);
    downmix << 1.0, 0.0, std::sqrt(3.0) / 3.0, std::sqrt(0.5), 0.0,  //
        0.0, 1.0, std::sqrt(3.0) / 3.0, 0.0, std::sqrt(0.5);

    // pan with 0+5+0, downmix and power normalise
    boost::optional<Eigen::VectorXd> pv = _psp->handle(position);

    if (pv) {
      Eigen::VectorXd _pv = pv.get();
      Eigen::VectorXd pvDownmix = downmix * _pv;
      pvDownmix /= pvDownmix.norm();

      // vary the output level by the balance between the front and rear
      // loudspeakers; 0dB at the front to -3dB at the back
      double front = _pv.head(3).maxCoeff();
      double back = _pv.tail(2).maxCoeff();

      pvDownmix = pvDownmix * std::pow(0.5, (0.5 * back / (front + back)));
      return pvDownmix;
    }
    return boost::none;
  }